

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_array.c
# Opt level: O0

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t *cmds)

{
  int iVar1;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  nsh_cmd_array_t *cmds_local;
  
  for (local_14 = 0; local_18 = local_14, local_14 < cmds->count - 1; local_14 = local_14 + 1) {
    while (local_18 = local_18 + 1, local_18 < cmds->count) {
      iVar1 = strcmp(cmds->array[local_14].name,cmds->array[local_18].name);
      if (0 < iVar1) {
        nsh_cmd_swap(cmds->array + local_14,cmds->array + local_18);
      }
    }
  }
  return NSH_STATUS_OK;
}

Assistant:

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t* cmds)
{
    for (unsigned int i = 0; i < cmds->count - 1; ++i) {
        for (unsigned int j = i + 1; j < cmds->count; ++j) {
            if (strcmp(cmds->array[i].name, cmds->array[j].name) > 0) {
                nsh_cmd_swap(&cmds->array[i], &cmds->array[j]);
            }
        }
    }
    return NSH_STATUS_OK;
}